

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retDelay.c
# Opt level: O1

int Abc_NtkRetimeTiming_rec(Abc_Obj_t *pObj,int fForward)

{
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  uint uVar4;
  int in_EDX;
  int Fill;
  int iVar5;
  long lVar6;
  
  pAVar1 = pObj->pNtk;
  iVar5 = pObj->Id;
  Vec_IntFillExtra(&pAVar1->vTravIds,iVar5 + 1,in_EDX);
  if (((long)iVar5 < 0) || ((pAVar1->vTravIds).nSize <= iVar5)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar2 = pObj->pNtk;
  iVar3 = pAVar2->nTravIds;
  if ((pAVar1->vTravIds).pArray[iVar5] == iVar3) {
    uVar4 = *(uint *)&pObj->field_0x14;
    goto LAB_0046fbe1;
  }
  iVar5 = pObj->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,Fill);
  if (((long)iVar5 < 0) || ((pAVar2->vTravIds).nSize <= iVar5)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar2->vTravIds).pArray[iVar5] = iVar3;
  if (fForward == 0) {
    if ((pObj->vFanins).nSize < 1) goto LAB_0046fbbe;
    lVar6 = 0;
    iVar5 = 0;
    do {
      iVar3 = Abc_NtkRetimeTiming_rec
                        ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]],0);
      if (iVar5 <= iVar3) {
        iVar5 = iVar3;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pObj->vFanins).nSize);
  }
  else if ((pObj->vFanouts).nSize < 1) {
LAB_0046fbbe:
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    do {
      iVar3 = Abc_NtkRetimeTiming_rec
                        ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]],
                         fForward);
      if (iVar5 <= iVar3) {
        iVar5 = iVar3;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pObj->vFanouts).nSize);
  }
  uVar4 = iVar5 * 0x1000 + 0x1000;
  *(uint *)&pObj->field_0x14 = (*(uint *)&pObj->field_0x14 & 0xfff) + iVar5 * 0x1000 + 0x1000;
LAB_0046fbe1:
  return uVar4 >> 0xc;
}

Assistant:

int Abc_NtkRetimeTiming_rec( Abc_Obj_t * pObj, int fForward )
{
    Abc_Obj_t * pNext;
    int i, LevelCur, LevelMax = 0;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return pObj->Level;
    Abc_NodeSetTravIdCurrent(pObj);
    // visit the next nodes
    if ( fForward )
    {
        Abc_ObjForEachFanout( pObj, pNext, i )
        {
            LevelCur = Abc_NtkRetimeTiming_rec( pNext, fForward );
            if ( LevelMax < LevelCur )
                LevelMax = LevelCur;
        }
    }
    else
    {
        Abc_ObjForEachFanin( pObj, pNext, i )
        {
            LevelCur = Abc_NtkRetimeTiming_rec( pNext, fForward );
            if ( LevelMax < LevelCur )
                LevelMax = LevelCur;
        }
    }
//    printf( "Node %3d -> Level %3d.\n", pObj->Id, LevelMax + 1 );
    pObj->Level = LevelMax + 1;
    return pObj->Level;
}